

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_list.c
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity **pplVar4;
  int iVar5;
  long lVar6;
  list_entity *plVar7;
  uint uVar8;
  uint uVar9;
  list_entity *plVar10;
  list_element *plVar11;
  list_element *plVar12;
  list_element *plVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  _Bool _Var17;
  _Bool cond;
  list_entity local_40;
  
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_add_tail");
  head.prev = &head;
  head.next = &head;
  lVar6 = 0;
  plVar13 = elements1;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  plVar12 = elements1;
  cunit_named_check(head.next == &elements1[0].node,"test_add_tail",0x62,"head->next");
  cunit_named_check(head.prev == &elements1[5].node,"test_add_tail",99,"head->prev");
  cunit_named_check(elements1[0].node.prev == &head,"test_add_tail",100,"elements1[0]->prev");
  cunit_named_check(elements1[5].node.next == &head,"test_add_tail",0x65,"elements1[%d]->next");
  lVar15 = 0x1050b0;
  lVar6 = 0;
  do {
    lVar6 = lVar6 + 1;
    cunit_named_check(lVar15 == *(long *)(lVar15 + -0x18),"test_add_tail",0x68,"elements1[%d]->next"
                     );
    lVar15 = lVar15 + 0x18;
  } while (lVar6 != 5);
  uVar8 = 1;
  lVar6 = 0;
  do {
    cunit_named_check(lVar6 + 0x105098 == *(long *)((long)&elements1[1].node.prev + lVar6),
                      "test_add_tail",0x6b,"elements1[%d]->prev",(ulong)uVar8);
    lVar6 = lVar6 + 0x18;
    uVar8 = uVar8 + 1;
  } while (lVar6 != 0x78);
  cunit_end_test("test_add_tail");
  cunit_start_test("test_add_head");
  head.prev = &head;
  lVar6 = 0;
  plVar7 = &head;
  lVar15 = 0;
  do {
    plVar10 = &plVar12->node;
    plVar10->next = plVar7;
    plVar10->prev = &head;
    plVar7->prev = plVar10;
    plVar7 = (list_entity *)(lVar15 * 0x18 + 0x105098);
    lVar15 = lVar15 + 1;
    lVar6 = lVar6 + -0x18;
    plVar12 = (list_element *)(plVar10 + 1);
  } while (lVar6 != -0x90);
  head.next = &elements1[5].node;
  cunit_named_check(true,"test_add_head",0x77,"head->next");
  cunit_named_check(head.prev == &elements1[0].node,"test_add_head",0x78,"head->prev");
  cunit_named_check(elements1[5].node.prev == &head,"test_add_head",0x79,"elements1[%d]->prev");
  cunit_named_check(elements1[0].node.next == &head,"test_add_head",0x7a,"elements1[0]->next");
  lVar15 = 0x1050b0;
  lVar6 = 0;
  do {
    lVar6 = lVar6 + 1;
    cunit_named_check(lVar15 == *(long *)(lVar15 + -0x10),"test_add_head",0x7d,"elements1[%d]->prev"
                     );
    lVar15 = lVar15 + 0x18;
  } while (lVar6 != 5);
  uVar8 = 1;
  lVar6 = 0;
  do {
    cunit_named_check(lVar6 + 0x105098 == *(long *)((long)&elements1[1].node.next + lVar6),
                      "test_add_head",0x80,"elements1[%d]->next",(ulong)uVar8);
    lVar6 = lVar6 + 0x18;
    uVar8 = uVar8 + 1;
  } while (lVar6 != 0x78);
  cunit_end_test("test_add_head");
  cunit_start_test("test_add_before");
  head.prev = &head;
  head.next = &head;
  lVar6 = 0;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    plVar7 = elements1[3].node.prev;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  elements2[0].node.next = &elements1[3].node;
  elements2[0].node.prev = elements1[3].node.prev;
  elements1[3].node.prev = &elements2[0].node;
  plVar7->next = (list_entity *)0x105128;
  lVar6 = 0;
  cunit_named_check(elements1[2].node.next == &elements2[0].node,"test_add_before",0x8c,
                    "elements1[2]->next");
  cunit_named_check(elements1[3].node.prev == &elements2[0].node,"test_add_before",0x8d,
                    "elements1[3]->prev");
  cunit_named_check(elements2[0].node.next == &elements1[3].node,"test_add_before",0x8e,
                    "elements2[0]->next");
  cunit_named_check(elements2[0].node.prev == &elements1[2].node,"test_add_before",0x8f,
                    "elements2[0]->prev");
  cunit_end_test("test_add_before");
  cunit_start_test("test_add_after");
  head.prev = &head;
  head.next = &head;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  elements2[0].node.next = elements1[2].node.next;
  elements2[0].node.prev = &elements1[2].node;
  (elements1[2].node.next)->prev = &elements2[0].node;
  elements1[2].node.next = &elements2[0].node;
  lVar6 = 0;
  cunit_named_check(true,"test_add_after",0x9a,"elements1[2]->next");
  cunit_named_check(elements1[3].node.prev == &elements2[0].node,"test_add_after",0x9b,
                    "elements1[3]->prev");
  cunit_named_check(elements2[0].node.next == &elements1[3].node,"test_add_after",0x9c,
                    "elements2[0]->next");
  cunit_named_check(elements2[0].node.prev == &elements1[2].node,"test_add_after",0x9d,
                    "elements2[0]->prev");
  cunit_end_test("test_add_after");
  cunit_start_test("test_remove");
  head.prev = &head;
  head.next = &head;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  (elements1[2].node.prev)->next = elements1[2].node.next;
  (elements1[2].node.next)->prev = elements1[2].node.prev;
  elements1[2].node = (list_entity)ZEXT816(0);
  lVar6 = 0;
  cunit_named_check(elements1[1].node.next == &elements1[3].node,"test_remove",0xa8,
                    "elements1[1]->next");
  cunit_named_check(elements1[3].node.prev == &elements1[1].node,"test_remove",0xa9,
                    "elements1[3]->prev");
  cunit_named_check(elements1[2].node.next == (list_entity *)0x0,"test_remove",0xaa,
                    "elements1[2]->next");
  cunit_named_check(elements1[2].node.prev == (list_entity *)0x0,"test_remove",0xab,
                    "elements1[2]->prev");
  cunit_end_test("test_remove");
  cunit_start_test("test_conditions");
  head.prev = &head;
  head.next = &head;
  cunit_named_check(true,"test_conditions",0xb3,"list_is_empty (1)");
  cunit_named_check(elements1[0].node.prev == (list_entity *)0x0 ||
                    elements1[0].node.next == (list_entity *)0x0,"test_conditions",0xb4,
                    "list_node_added (1)");
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  lVar6 = 0;
  cunit_named_check(head.prev != &head || head.next != &head,"test_conditions",0xb8,
                    "list_is_empty (1)");
  cunit_named_check(elements1[0].node.prev != (list_entity *)0x0 &&
                    elements1[0].node.next != (list_entity *)0x0,"test_conditions",0xb9,
                    "list_node_added (1)");
  cunit_named_check(head.next == &elements1[0].node,"test_conditions",0xbb,"list_is_first (1)");
  cunit_named_check(head.prev == &elements1[5].node,"test_conditions",0xbc,"list_is_last (1)");
  cunit_named_check(head.next != &elements1[1].node,"test_conditions",0xbd,"list_is_first (2)");
  cunit_named_check(head.prev != &elements1[1].node,"test_conditions",0xbe,"list_is_last (2)");
  cunit_end_test("test_conditions");
  cunit_start_test("test_merge");
  head.prev = &head;
  head.next = &head;
  local_40.next = &local_40;
  local_40.prev = local_40.next;
  cunit_named_check(true,"test_merge",0xcb,"list_is_empty (1)");
  cunit_named_check(elements1[0].node.prev == (list_entity *)0x0 ||
                    elements1[0].node.next == (list_entity *)0x0,"test_merge",0xcc,
                    "list_node_added (1)");
  cunit_named_check(elements2[0].node.prev == (list_entity *)0x0 ||
                    elements2[0].node.next == (list_entity *)0x0,"test_merge",0xcd,
                    "list_node_added (1)");
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  lVar6 = 0;
  plVar12 = elements2;
  do {
    plVar7 = (list_entity *)((long)&elements2[0].node.next + lVar6);
    plVar7->next = &local_40;
    *(list_entity **)((long)&elements2[0].node.prev + lVar6) = local_40.prev;
    pplVar4 = &(local_40.prev)->next;
    local_40.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  if ((head.next)->prev == head.prev) {
    _Var17 = false;
  }
  else {
    uVar16 = 0;
    plVar7 = head.next;
    do {
      cunit_named_check(plVar13 == (list_element *)&plVar7[-1].prev,"test_merge",0xd8,
                        "for_each iteration %d failed",uVar16 & 0xffffffff);
      uVar16 = uVar16 + 1;
      plVar7 = plVar7->next;
      plVar13 = plVar13 + 1;
    } while (plVar7->prev != head.prev);
    _Var17 = uVar16 == 6;
  }
  cond = false;
  cunit_named_check(_Var17,"test_merge",0xdb,"missing elements from list 1");
  if ((local_40.next)->prev != local_40.prev) {
    uVar16 = 0;
    plVar7 = local_40.next;
    do {
      cunit_named_check(plVar12 == (list_element *)&plVar7[-1].prev,"test_merge",0xdf,
                        "for_each iteration %d failed",uVar16 & 0xffffffff);
      uVar16 = uVar16 + 1;
      plVar7 = plVar7->next;
      plVar12 = plVar12 + 1;
    } while (plVar7->prev != local_40.prev);
    cond = uVar16 == 6;
  }
  cunit_named_check(cond,"test_merge",0xe2,"missing elements from list 2");
  if ((local_40.next != &local_40) || (local_40.prev != &local_40)) {
    (head.prev)->next = local_40.next;
    (local_40.next)->prev = head.prev;
    head.prev = local_40.prev;
    (local_40.prev)->next = &head;
    local_40.next = &local_40;
    local_40.prev = &local_40;
  }
  _Var17 = false;
  cunit_named_check(true,"test_merge",0xe5,"list_is_empty (2)");
  cunit_named_check(head.prev != &head || head.next != &head,"test_merge",0xe6,"!list_is_empty (1)")
  ;
  if ((head.next)->prev != head.prev) {
    plVar12 = elements1;
    plVar13 = elements1;
    uVar16 = 0;
    plVar7 = head.next;
    do {
      plVar11 = plVar13;
      if (5 >= uVar16) {
        plVar11 = plVar12;
      }
      cunit_named_check((list_element *)&plVar7[-1].prev == plVar11,"test_merge",
                        (uint)(5 < uVar16) * 3 + 0xeb,"for_each iteration %d failed",
                        uVar16 & 0xffffffff);
      uVar16 = uVar16 + 1;
      plVar7 = plVar7->next;
      plVar12 = plVar12 + 1;
      plVar13 = plVar13 + 1;
    } while (plVar7->prev != head.prev);
    _Var17 = uVar16 == 0xc;
  }
  lVar6 = 0;
  cunit_named_check(_Var17,"test_merge",0xf2,"missing elements from merged list");
  cunit_end_test("test_merge");
  cunit_start_test("test_element_macros");
  head.prev = &head;
  head.next = &head;
  plVar13 = elements1;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  lVar15 = 0;
  cunit_named_check(head.next == &elements1[0].node,"test_element_macros",0xfd,"list_first_element")
  ;
  cunit_named_check(head.prev == &elements1[5].node,"test_element_macros",0xfe,"list_first_element")
  ;
  lVar6 = 0x1050a8;
  cunit_named_check(elements1[0].node.next == &elements1[1].node,"test_element_macros",0x100,
                    "list_next_element(elements1[0])");
  cunit_named_check(elements1[1].node.prev == &elements1[0].node,"test_element_macros",0x101,
                    "list_prev_element(elements1[1])");
  cunit_end_test("test_element_macros");
  cunit_start_test("test_for_each_macros");
  head.prev = &head;
  head.next = &head;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar15);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar15) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x90);
  if ((head.next)->prev == head.prev) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    plVar7 = head.next;
    do {
      cunit_named_check(plVar13 == (list_element *)&plVar7[-1].prev,"test_for_each_macros",0x10f,
                        "for_each iteration %d failed",(ulong)uVar8);
      plVar7 = plVar7->next;
      uVar8 = uVar8 + 1;
      plVar13 = plVar13 + 1;
    } while (plVar7->prev != head.prev);
  }
  cunit_named_check(uVar8 == 6,"test_for_each_macros",0x112,"for_each only had %d of %d iterations",
                    (ulong)uVar8,6);
  uVar8 = 1;
  uVar16 = 1;
  uVar14 = 1;
  if (elements1[1].node.prev != &elements1[4].node) {
    lVar15 = 0x1050a8;
    do {
      cunit_named_check(lVar6 == lVar15,"test_for_each_macros",0x116,
                        "for_element_range iteration %d failed",uVar16);
      plVar1 = (long *)(lVar15 + 8);
      lVar15 = *plVar1 + -8;
      uVar14 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar14;
      lVar6 = lVar6 + 0x18;
    } while (*(long *)(*plVar1 + 8) != 0x1050f8);
  }
  uVar9 = 0;
  cunit_named_check(uVar14 == 5,"test_for_each_macros",0x119,
                    "for_element_range only had %d of %d iterations",(ulong)(uVar14 - 1),4);
  if (elements1[1].node.prev != head.prev) {
    uVar8 = 1;
    lVar15 = 0x1050a8;
    lVar6 = 0x1050a8;
    do {
      cunit_named_check(lVar15 == lVar6,"test_for_each_macros",0x11d,
                        "element_to_last iteration %d failed",(ulong)uVar8);
      plVar1 = (long *)(lVar6 + 8);
      lVar6 = *plVar1 + -8;
      uVar8 = uVar8 + 1;
      lVar15 = lVar15 + 0x18;
    } while (*(list_entity **)(*plVar1 + 8) != head.prev);
  }
  cunit_named_check(uVar8 == 6,"test_for_each_macros",0x120,
                    "element_to_last only had %d of %d iterations",(ulong)(uVar8 - 1),5);
  if ((head.next)->prev != &elements1[4].node) {
    plVar13 = elements1;
    uVar9 = 0;
    plVar7 = head.next;
    do {
      cunit_named_check(plVar13 == (list_element *)&plVar7[-1].prev,"test_for_each_macros",0x124,
                        "first_to_element iteration %d failed",(ulong)uVar9);
      plVar7 = plVar7->next;
      uVar9 = uVar9 + 1;
      plVar13 = plVar13 + 1;
    } while (plVar7->prev != &elements1[4].node);
  }
  lVar6 = 0;
  cunit_named_check(uVar9 == 5,"test_for_each_macros",0x127,
                    "first_to_element only had %d of %d iterations",(ulong)(uVar9 - 1),5);
  cunit_end_test("test_for_each_macros");
  cunit_start_test("test_for_each_reverse_macros");
  head.prev = &head;
  head.next = &head;
  plVar13 = elements1;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  if ((head.prev)->next == head.next) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    plVar12 = elements1 + 5;
    plVar7 = head.prev;
    do {
      cunit_named_check(plVar12 == (list_element *)&plVar7[-1].prev,"test_for_each_reverse_macros",
                        0x137,"for_each iteration %d failed",uVar16);
      uVar16 = (ulong)((int)uVar16 + 1);
      plVar7 = plVar7->prev;
      plVar12 = plVar12 + -1;
    } while (plVar7->next != head.next);
  }
  cunit_named_check((int)uVar16 == 6,"test_for_each_reverse_macros",0x13b,
                    "for_each only had %d of %d iterations",uVar16,6);
  uVar8 = 1;
  uVar16 = 1;
  uVar14 = 1;
  if (elements1[4].node.next != &elements1[1].node) {
    plVar11 = elements1 + 4;
    plVar12 = elements1 + 4;
    do {
      cunit_named_check(plVar11 == plVar12,"test_for_each_reverse_macros",0x140,
                        "for_element_range iteration %d failed",uVar16);
      uVar14 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar14;
      plVar7 = (plVar12->node).prev;
      plVar12 = (list_element *)&plVar7[-1].prev;
      plVar11 = plVar11 + -1;
    } while (plVar7->next != (list_entity *)0x1050b0);
  }
  uVar9 = 0;
  cunit_named_check(uVar14 == 5,"test_for_each_reverse_macros",0x144,
                    "for_element_range only had %d of %d iterations",(ulong)(uVar14 - 1),4);
  if ((head.prev)->next != (list_entity *)0x1050b0) {
    uVar8 = 1;
    plVar12 = elements1 + 5;
    plVar7 = head.prev;
    do {
      cunit_named_check(plVar12 == (list_element *)&plVar7[-1].prev,"test_for_each_reverse_macros",
                        0x149,"element_to_last iteration %d failed",(ulong)uVar8);
      uVar8 = uVar8 + 1;
      plVar7 = plVar7->prev;
      plVar12 = plVar12 + -1;
    } while (plVar7->next != (list_entity *)0x1050b0);
  }
  cunit_named_check(uVar8 == 6,"test_for_each_reverse_macros",0x14d,
                    "element_to_last only had %d of %d iterations",(ulong)(uVar8 - 1),5);
  if (elements1[4].node.next != head.next) {
    plVar11 = elements1 + 4;
    plVar12 = elements1 + 4;
    uVar9 = 0;
    do {
      cunit_named_check(plVar11 == plVar12,"test_for_each_reverse_macros",0x152,
                        "first_to_element iteration %d failed",(ulong)uVar9);
      uVar9 = uVar9 + 1;
      plVar7 = (plVar12->node).prev;
      plVar12 = (list_element *)&plVar7[-1].prev;
      plVar11 = plVar11 + -1;
    } while (plVar7->next != head.next);
  }
  lVar6 = 0;
  cunit_named_check(uVar9 == 5,"test_for_each_reverse_macros",0x156,
                    "first_to_element only had %d of %d iterations",(ulong)(uVar9 - 1),5);
  cunit_end_test("test_for_each_reverse_macros");
  cunit_start_test("test_for_each_save_macro");
  head.prev = &head;
  head.next = &head;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  if ((head.next)->prev == head.prev) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    plVar7 = head.next;
    do {
      plVar10 = plVar7->next;
      cunit_named_check(plVar13 == (list_element *)&plVar7[-1].prev,"test_for_each_save_macro",0x166
                        ,"for_each_save iteration %d failed",(ulong)uVar8);
      plVar2 = plVar7->next;
      plVar3 = plVar7->prev;
      plVar3->next = plVar2;
      plVar2->prev = plVar3;
      plVar7->next = (list_entity *)0x0;
      plVar7->prev = (list_entity *)0x0;
      uVar8 = uVar8 + 1;
      plVar13 = plVar13 + 1;
      plVar7 = plVar10;
    } while (plVar10->prev != head.prev);
  }
  lVar6 = 0;
  cunit_named_check(uVar8 == 6,"test_for_each_save_macro",0x16a,
                    "for_each_save only had %d of %d iterations",(ulong)uVar8,6);
  cunit_named_check(head.prev == &head && head.next == &head,"test_for_each_save_macro",0x16b,
                    "for_each_save list not empty after loop with remove");
  cunit_end_test("test_for_each_save_macro");
  cunit_start_test("test_for_each_reverse_save_macro");
  head.prev = &head;
  head.next = &head;
  do {
    plVar7 = (list_entity *)((long)&elements1[0].node.next + lVar6);
    plVar7->next = &head;
    *(list_entity **)((long)&elements1[0].node.prev + lVar6) = head.prev;
    pplVar4 = &(head.prev)->next;
    head.prev = plVar7;
    *pplVar4 = plVar7;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  if ((head.prev)->next == head.next) {
    uVar8 = 0;
  }
  else {
    plVar13 = elements1 + 5;
    uVar8 = 0;
    plVar7 = head.prev;
    do {
      plVar10 = plVar7->prev;
      cunit_named_check(plVar13 == (list_element *)&plVar7[-1].prev,
                        "test_for_each_reverse_save_macro",0x17a,"for_each_save iteration %d failed"
                        ,(ulong)uVar8);
      plVar2 = plVar7->next;
      plVar3 = plVar7->prev;
      plVar3->next = plVar2;
      plVar2->prev = plVar3;
      uVar8 = uVar8 + 1;
      plVar7->next = (list_entity *)0x0;
      plVar7->prev = (list_entity *)0x0;
      plVar13 = plVar13 + -1;
      plVar7 = plVar10;
    } while (plVar10->next != head.next);
  }
  cunit_named_check(uVar8 == 6,"test_for_each_reverse_save_macro",0x17f,
                    "for_each_save only had %d of %d iterations",(ulong)uVar8,6);
  cunit_named_check(head.prev == &head && head.next == &head,"test_for_each_reverse_save_macro",
                    0x180,"for_each_save list not empty after loop with remove");
  cunit_end_test("test_for_each_reverse_save_macro");
  iVar5 = FINISH_TESTING();
  return iVar5;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  test_add_tail();
  test_add_head();
  test_add_before();
  test_add_after();
  test_remove();
  test_conditions();
  test_merge();
  test_element_macros();
  test_for_each_macros();
  test_for_each_reverse_macros();
  test_for_each_save_macro();
  test_for_each_reverse_save_macro();

  return FINISH_TESTING();
}